

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VProd_Serial(N_Vector x,N_Vector y,N_Vector z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector y_local;
  N_Vector x_local;
  
  iVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 8);
  lVar3 = *(long *)((long)y->content + 8);
  lVar4 = *(long *)((long)z->content + 8);
  for (i = 0; i < iVar1; i = i + 1) {
    *(double *)(lVar4 + (long)i * 8) =
         *(double *)(lVar2 + (long)i * 8) * *(double *)(lVar3 + (long)i * 8);
  }
  return;
}

Assistant:

void N_VProd_Serial(N_Vector x, N_Vector y, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *yd, *zd;

  xd = yd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = xd[i]*yd[i];

  return;
}